

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QItemSelectionRange>::copyAppend
          (QGenericArrayOps<QItemSelectionRange> *this,QItemSelectionRange *b,QItemSelectionRange *e
          )

{
  QItemSelectionRange *pQVar1;
  long lVar2;
  
  if ((b != e) && (b < e)) {
    pQVar1 = (this->super_QArrayDataPointer<QItemSelectionRange>).ptr;
    lVar2 = (this->super_QArrayDataPointer<QItemSelectionRange>).size;
    do {
      QPersistentModelIndex::QPersistentModelIndex(&pQVar1[lVar2].tl,&b->tl);
      QPersistentModelIndex::QPersistentModelIndex(&pQVar1[lVar2].br,&b->br);
      lVar2 = (this->super_QArrayDataPointer<QItemSelectionRange>).size + 1;
      (this->super_QArrayDataPointer<QItemSelectionRange>).size = lVar2;
      b = b + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }